

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexInt<short>
               (vector<short,_std::allocator<short>_> *src,
               vector<short,_std::allocator<short>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  int16_t a;
  value_type vVar1;
  short sVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  uint *puVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  const_reference pvVar11;
  short *__s;
  reference ppVar12;
  reference pvVar13;
  pair<const_unsigned_int,_short> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
  *__range3;
  ulong uStack_70;
  uint32_t vidx;
  size_t i;
  undefined1 local_60 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<short,_std::allocator<short>_> *dst_local;
  vector<short,_std::allocator<short>_> *src_local;
  
  if (dst == (vector<short,_std::allocator<short>_> *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket = (__node_base_ptr)faceVertexIndices;
    sVar5 = ::std::vector<short,_std::allocator<short>_>::size(src);
    sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       vdata._M_h._M_single_bucket);
    if (sVar5 == sVar6) {
      sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         vdata._M_h._M_single_bucket);
      if (sVar5 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
        ::unordered_map((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                         *)local_60);
        i._4_4_ = 0;
        for (uStack_70 = 0; uVar3 = uStack_70,
            sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               vdata._M_h._M_single_bucket), uVar3 < sVar5;
            uStack_70 = uStack_70 + 1) {
          pvVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              vdata._M_h._M_single_bucket,uStack_70);
          __range3._4_4_ = *pvVar7;
          puVar8 = ::std::max<unsigned_int>((uint *)((long)&__range3 + 4),(uint *)((long)&i + 4));
          i._4_4_ = *puVar8;
          sVar9 = ::std::
                  unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                  ::count((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                           *)local_60,(key_type *)((long)&__range3 + 4));
          if (sVar9 == 0) {
            pvVar11 = ::std::vector<short,_std::allocator<short>_>::operator[](src,uStack_70);
            vVar1 = *pvVar11;
            pmVar10 = ::std::
                      unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                      ::operator[]((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                                    *)local_60,(key_type *)((long)&__range3 + 4));
            *pmVar10 = vVar1;
          }
          else {
            pmVar10 = ::std::
                      unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                      ::operator[]((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                                    *)local_60,(key_type *)((long)&__range3 + 4));
            a = *pmVar10;
            pvVar11 = ::std::vector<short,_std::allocator<short>_>::operator[](src,uStack_70);
            bVar4 = math::is_close(a,*pvVar11);
            if (!bVar4) {
              src_local._7_1_ = false;
              goto LAB_004ff207;
            }
          }
        }
        ::std::vector<short,_std::allocator<short>_>::resize(dst,(ulong)(i._4_4_ + 1));
        __s = ::std::vector<short,_std::allocator<short>_>::data(dst);
        memset(__s,0,(ulong)(i._4_4_ + 1) << 1);
        __end0 = ::std::
                 unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                 ::begin((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                          *)local_60);
        v = (pair<const_unsigned_int,_short> *)
            ::std::
            unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
            ::end((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                   *)local_60);
        while (bVar4 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_short>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_short>,_false>
                                    *)&v), bVar4) {
          ppVar12 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_short>,_false,_false>::operator*
                              (&__end0);
          sVar2 = ppVar12->second;
          pvVar13 = ::std::vector<short,_std::allocator<short>_>::operator[]
                              (dst,(ulong)ppVar12->first);
          *pvVar13 = sVar2;
          ::std::__detail::_Node_iterator<std::pair<const_unsigned_int,_short>,_false,_false>::
          operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_004ff207:
        __range3._0_4_ = 1;
        ::std::
        unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
                          *)local_60);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}